

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector_test.cc
# Opt level: O3

void __thiscall
fizplex::SVectorTest_ChangeValsThroughIteratorSetsRightVal_Test::TestBody
          (SVectorTest_ChangeValsThroughIteratorSetsRightVal_Test *this)

{
  double rhs_value;
  bool bVar1;
  Nonzero *n;
  pointer pNVar2;
  char *message;
  initializer_list<fizplex::SVector::Nonzero> l;
  SVector v;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  SVector local_60;
  Nonzero local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 7;
  uStack_10 = 0xc000e147ae147ae1;
  local_28 = 2;
  uStack_20 = 0x4022000000000000;
  local_38 = 1;
  uStack_30 = 0x4008000000000000;
  local_48.index = 0;
  local_48.value = -2.0;
  l._M_len = 4;
  l._M_array = &local_48;
  SVector::SVector(&local_60,l);
  for (pNVar2 = local_60.values.
                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pNVar2 != local_60.values.
                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                ._M_impl.super__Vector_impl_data._M_finish; pNVar2 = pNVar2 + 1) {
    pNVar2->value = pNVar2->value * 3.0;
  }
  rhs_value = SVector::get_value(&local_60,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_48,"27.0","v.get_value(2)",27.0,rhs_value);
  if ((char)local_48.index == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_48.value == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_48.value;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (((local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_70.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_60.values.
      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.values.
                    super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.values.
                          super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SVectorTest, ChangeValsThroughIteratorSetsRightVal) {
  SVector v = {{0, -2}, {1, 3}, {2, 9}, {7, -2.11}};
  for (auto &n : v)
    n.value *= 3;
  EXPECT_DOUBLE_EQ(27.0, v.get_value(2));
}